

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to-renderscene-main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  size_type sVar1;
  undefined8 __nptr;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *piVar7;
  ostream *poVar8;
  long *plVar9;
  long lVar10;
  size_type *psVar11;
  long *plVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char cVar15;
  char *pcVar16;
  char *pcVar17;
  ulong __val;
  int iVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string obj_str;
  string mtl_filename;
  string obj_filename;
  string mtl_str;
  string err;
  string warn;
  string filepath;
  string __str;
  string usd_basedir;
  AssetResolutionResolver arr;
  USDZAsset usdz_asset;
  RenderSceneConverter converter;
  RenderSceneConverterEnv env;
  Stage stage;
  undefined1 local_2238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2208;
  ulong local_21f8;
  long *local_21f0;
  long local_21e8;
  long local_21e0;
  long lStack_21d8;
  double local_21d0;
  string local_21c8;
  string local_21a8;
  char *local_2188;
  string local_2180;
  string local_2160;
  ulong local_2140;
  ulong local_2138;
  long *local_2130;
  uint local_2128;
  long local_2120 [2];
  string local_2110;
  undefined1 local_20f0 [8];
  _Alloc_hider local_20e8;
  undefined1 local_20e0 [24];
  pointer local_20c8;
  pointer pbStack_20c0;
  pointer local_20b8;
  size_t local_20b0;
  _Rb_tree_node_base local_20a0;
  size_t local_2080;
  ios_base local_1ff8 [264];
  USDZAsset local_1ef0;
  RenderScene local_1e98;
  undefined1 local_1ce0 [16];
  undefined1 auStack_1cd0 [32];
  _Alloc_hider _Stack_1cb0;
  _Base_ptr local_1ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1ca0;
  _Alloc_hider _Stack_1c90;
  size_type local_1c88;
  undefined1 local_1c78 [48];
  char local_1c48 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c40;
  _Alloc_hider local_1c30;
  size_type local_1c28;
  _Rb_tree_node_base local_1c18;
  size_type local_1bf8;
  undefined1 local_1be8 [48];
  char local_1bb8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bb0;
  _Alloc_hider local_1ba0;
  size_type local_1b98;
  undefined1 local_1b88 [48];
  _Rb_tree_color local_1b58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b50;
  optional<tinyusdz::Path::PathType> local_1b40;
  size_t local_1b38;
  char local_1b28 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b20;
  _Alloc_hider local_1b10;
  size_type local_1b08;
  undefined1 local_1af8 [48];
  char local_1ac8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ac0;
  _Alloc_hider local_1ab0;
  size_type local_1aa8;
  undefined1 local_1a98 [48];
  undefined1 local_1a68 [48];
  storage_union local_1a38;
  storage_union *local_1a28;
  storage_union *local_1a20;
  pointer local_1a18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_19f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_19f0;
  _Base_ptr local_19e8;
  _Rb_tree_node_base local_19d8;
  size_t local_19b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1998;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1990;
  size_t local_1988;
  int local_1980;
  undefined1 local_1978 [240];
  _Alloc_hider local_1888;
  size_type local_1880;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1878;
  _Alloc_hider local_1868;
  size_type local_1860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1858;
  _Alloc_hider local_1848;
  size_type local_1840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1838;
  RenderSceneConverterEnv local_1828;
  undefined1 local_1698 [32];
  _Rb_tree_node_base local_1678;
  size_t local_1658;
  _Alloc_hider local_1650;
  size_type local_1648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1640;
  int64_t local_1630;
  LayerMetas local_1628;
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined2 local_60;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  unsigned_long local_40;
  bool local_38;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    pcVar16 = *argv;
    if (pcVar16 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x6aa2e0);
    }
    else {
      sVar6 = strlen(pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," input.usd [OPTIONS].\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\nOptions\n\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --timecode VALUE: Specify timecode value(e.g. 3.14)\n",0x36)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --noidxbuild: Do not rebuild vertex indices\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --notri: Do not triangulate mesh\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --nousdprint: Do not print parsed USD\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  --dumpusd: Dump scene as USD(USDA Ascii)\n",0x2b);
    iVar18 = 1;
  }
  else {
    local_2160._M_dataplus._M_p = (pointer)&local_2160.field_2;
    local_2160._M_string_length = 0;
    local_2160.field_2._M_local_buf[0] = '\0';
    iVar18 = 1;
    local_21f8 = CONCAT44(local_21f8._4_4_,
                          (int)CONCAT71((int7)((ulong)local_2160._M_dataplus._M_p >> 8),1));
    local_21d0 = NAN;
    local_2188 = (char *)0x0;
    bVar4 = true;
    local_2140 = 0;
    local_2138 = 0;
    do {
      pcVar16 = argv[iVar18];
      iVar5 = strcmp(pcVar16,"--notri");
      if (iVar5 == 0) {
        bVar4 = false;
      }
      else {
        iVar5 = strcmp(pcVar16,"--noidxbuild");
        if (iVar5 == 0) {
          local_21f8 = local_21f8 & 0xffffffff00000000;
        }
        else {
          iVar5 = strcmp(pcVar16,"--nousdprint");
          if (iVar5 == 0) {
            local_2188 = (char *)CONCAT71((int7)(CONCAT44(extraout_var,iVar5) >> 8),1);
          }
          else {
            iVar5 = strcmp(pcVar16,"--dumpobj");
            if (iVar5 == 0) {
              local_2138 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar5) >> 8),1);
            }
            else {
              iVar5 = strcmp(pcVar16,"--dumpusd");
              if (iVar5 == 0) {
                local_2140 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar5) >> 8),1);
              }
              else {
                iVar5 = strcmp(pcVar16,"--timecode");
                sVar1 = local_2160._M_string_length;
                if (iVar5 == 0) {
                  iVar18 = iVar18 + 1;
                  if (argc <= iVar18) {
                    iVar18 = -1;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"arg is missing for --timecode flag.\n",0x24);
                    goto LAB_001283e3;
                  }
                  std::__cxx11::string::string
                            ((string *)local_1698,argv[iVar18],(allocator *)local_20f0);
                  __nptr = local_1698._0_8_;
                  piVar7 = __errno_location();
                  iVar5 = *piVar7;
                  *piVar7 = 0;
                  local_21d0 = strtod((char *)__nptr,(char **)local_1ce0);
                  if (local_1ce0._0_8_ == __nptr) {
                    std::__throw_invalid_argument("stod");
LAB_0012848c:
                    std::__throw_out_of_range("stod");
                  }
                  if (*piVar7 == 0) {
                    *piVar7 = iVar5;
                  }
                  else if (*piVar7 == 0x22) goto LAB_0012848c;
                  if ((pointer)local_1698._0_8_ != (pointer)(local_1698 + 0x10)) {
                    operator_delete((void *)local_1698._0_8_,
                                    (ulong)((long)&(((Path *)local_1698._16_8_)->_prim_part).
                                                   _M_dataplus._M_p + 1));
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Use timecode: ",0xe);
                  poVar8 = std::ostream::_M_insert<double>(local_21d0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                }
                else {
                  strlen(pcVar16);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_2160,0,(char *)sVar1,(ulong)pcVar16);
                }
              }
            }
          }
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < argc);
    local_2180._M_dataplus._M_p = (pointer)&local_2180.field_2;
    local_2180._M_string_length = 0;
    local_2180.field_2._M_local_buf[0] = '\0';
    local_21a8._M_dataplus._M_p = (pointer)&local_21a8.field_2;
    local_21a8._M_string_length = 0;
    local_21a8.field_2._M_local_buf[0] = '\0';
    local_1678._M_left = &local_1678;
    local_1698._16_8_ = (pointer)0x0;
    local_1698._0_8_ = (pointer)0x0;
    local_1698._8_8_ = (pointer)0x0;
    local_1678._M_color = _S_red;
    local_1678._M_parent = (_Base_ptr)0x0;
    local_1658 = 0;
    local_1650._M_p = (pointer)&local_1640;
    local_1648 = 0;
    local_1640._M_local_buf[0] = '\0';
    local_1630 = -1;
    local_1678._M_right = local_1678._M_left;
    tinyusdz::LayerMetas::LayerMetas(&local_1628);
    local_100._M_p = (pointer)&local_f0;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_e0._M_p = (pointer)&local_d0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_b8._M_left = &local_b8;
    local_b8._M_color = _S_red;
    local_b8._M_parent = (_Base_ptr)0x0;
    local_98 = 0;
    local_88._M_left = &local_88;
    local_88._M_color = _S_red;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_60._0_1_ = true;
    local_60._1_1_ = true;
    local_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    local_40 = 1;
    local_38 = true;
    local_b8._M_right = local_b8._M_left;
    local_88._M_right = local_88._M_left;
    bVar3 = tinyusdz::IsUSD(&local_2160,(string *)0x0);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"File not found or not a USD format: ",0x24);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2160._M_dataplus._M_p,
                          local_2160._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    aStack_1ca0._M_allocated_capacity = (size_type)&_Stack_1cb0;
    auStack_1cd0._24_8_ = 0;
    local_1ca8 = (_Base_ptr)0x0;
    _Stack_1c90._M_p = (pointer)0x0;
    local_1ce0._0_8_ = (pointer)0x4000ffffffff;
    local_1ce0._8_8_ = 1;
    auStack_1cd0._0_8_ = 0x80000000400;
    auStack_1cd0._8_8_ = (undefined1 *)0x400000800;
    auStack_1cd0._16_8_ = (undefined1 *)0x0;
    _Stack_1cb0._M_p = (pointer)0x0;
    local_1c88 = 1;
    aStack_1ca0._8_8_ = aStack_1ca0._M_allocated_capacity;
    bVar3 = tinyusdz::LoadUSDFromFile
                      (&local_2160,(Stage *)local_1698,&local_2180,&local_21a8,
                       (USDLoadOptions *)local_1ce0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                 *)(auStack_1cd0 + 0x18));
    if (local_2180._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARN : ",7);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2180._M_dataplus._M_p,
                          local_2180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if (local_21a8._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERR : ",6);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_21a8._M_dataplus._M_p,
                          local_21a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if (bVar3) {
      bVar3 = tinyusdz::IsUSDZ(&local_2160);
      if (((ulong)local_2188 & 1) == 0) {
        tinyusdz::Stage::ExportToString_abi_cxx11_((string *)local_1ce0,(Stage *)local_1698,false);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1ce0._0_8_,local_1ce0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--------------------------------------",0x26);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        if ((pointer)local_1ce0._0_8_ != (pointer)auStack_1cd0) {
          operator_delete((void *)local_1ce0._0_8_,auStack_1cd0._0_8_ + 1);
        }
      }
      local_1e98.usd_filename._M_dataplus._M_p = (pointer)&local_1e98.usd_filename.field_2;
      local_1e98.usd_filename._M_string_length = 0;
      local_1e98.usd_filename.field_2._M_local_buf[0] = '\0';
      local_1e98.meta.copyright._M_dataplus._M_p = (pointer)&local_1e98.meta.copyright.field_2;
      local_1e98.meta.copyright._M_string_length = 0;
      local_1e98.meta.copyright.field_2._M_local_buf[0] = '\0';
      local_1e98.meta.comment._M_dataplus._M_p = (pointer)&local_1e98.meta.comment.field_2;
      local_1e98.meta.comment._M_string_length = 0;
      local_1e98.meta.comment.field_2._M_local_buf[0] = '\0';
      local_1e98.meta.upAxis._M_dataplus._M_p = (pointer)&local_1e98.meta.upAxis.field_2;
      local_1e98.meta.upAxis.field_2._M_allocated_capacity._0_2_ = 0x59;
      local_1e98.meta.upAxis._M_string_length = 1;
      local_1e98.meta.startTimeCode.has_value_ = false;
      local_1e98.meta.startTimeCode.contained = (storage_t<double>)0x0;
      local_1e98.meta.endTimeCode.has_value_ = false;
      local_1e98.meta.endTimeCode.contained = (storage_t<double>)0x0;
      local_1e98.meta.framesPerSecond = 24.0;
      local_1e98.meta.timeCodesPerSecond = 24.0;
      local_1e98.meta.metersPerUnit = 1.0;
      local_1e98.meta.autoPlay = true;
      local_1e98.default_root_node = 0;
      memset(&local_1e98.nodes,0,0xf0);
      auStack_1cd0._8_8_ = local_1ce0 + 8;
      local_1ce0._8_8_ = local_1ce0._8_8_ & 0xffffffff00000000;
      auStack_1cd0._0_8_ = 0;
      auStack_1cd0._24_8_ = 0;
      aStack_1ca0._8_8_ = &local_1ca8;
      local_1ca8 = (_Base_ptr)((ulong)local_1ca8 & 0xffffffff00000000);
      aStack_1ca0._M_allocated_capacity = 0;
      local_1c88 = 0;
      local_1c78._16_8_ = local_1c78;
      local_1c78._0_4_ = 0;
      local_1c78._8_8_ = (pointer)0x0;
      local_1c78._32_8_ = 0;
      local_1c40._8_8_ = local_1c48;
      local_1c48[0] = '\0';
      local_1c48[1] = '\0';
      local_1c48[2] = '\0';
      local_1c48[3] = '\0';
      local_1c40._M_allocated_capacity = 0;
      local_1c28 = 0;
      local_1c18._M_left = &local_1c18;
      local_1c18._M_color = 0;
      local_1c18._M_parent = (_Base_ptr)0x0;
      local_1bf8 = 0;
      local_1be8._16_8_ = local_1be8;
      local_1be8._0_4_ = 0;
      local_1be8._8_8_ = (pointer)0x0;
      local_1be8._32_8_ = 0;
      local_1bb0._8_8_ = local_1bb8;
      local_1bb8[0] = '\0';
      local_1bb8[1] = '\0';
      local_1bb8[2] = '\0';
      local_1bb8[3] = '\0';
      local_1bb0._M_allocated_capacity = 0;
      local_1b98 = 0;
      local_1b88._16_8_ = local_1b88;
      local_1b88._0_4_ = 0;
      local_1b88._8_8_ = (pointer)0x0;
      local_1b88._32_8_ = 0;
      local_1b50._8_8_ = local_1b58;
      local_1b58[0] = _S_red;
      local_1b50._M_allocated_capacity = 0;
      local_1b38 = 0;
      local_1b20._8_8_ = local_1b28;
      local_1b28[0] = '\0';
      local_1b28[1] = '\0';
      local_1b28[2] = '\0';
      local_1b28[3] = '\0';
      local_1b20._M_allocated_capacity = 0;
      local_1b08 = 0;
      local_1af8._16_8_ = local_1af8;
      local_1af8._0_4_ = 0;
      local_1af8._8_8_ = (pointer)0x0;
      local_1af8._32_8_ = 0;
      local_1ac0._8_8_ = local_1ac8;
      local_1ac8[0] = '\0';
      local_1ac8[1] = '\0';
      local_1ac8[2] = '\0';
      local_1ac8[3] = '\0';
      local_1ac0._M_allocated_capacity = 0;
      local_1aa8 = 0;
      local_1a98._16_8_ = local_1a98;
      local_1a98._0_4_ = 0;
      local_1a98._8_8_ = (pointer)0x0;
      local_1a98._32_8_ = 0;
      local_1a68._16_8_ = local_1a68;
      local_1a68._0_4_ = _S_red;
      local_1a68._8_8_ = (pointer)0x0;
      local_1a68._32_8_ = 0;
      local_1a28 = &local_1a38;
      local_1a38._0_4_ = 0;
      local_1a38._8_8_ = 0;
      local_1a18 = (pointer)0x0;
      local_19f8 = &local_1a08;
      local_1a08._M_allocated_capacity._0_4_ = 0;
      local_1a08._8_8_ = 0;
      local_19e8 = (_Base_ptr)0x0;
      local_19d8._M_left = &local_19d8;
      local_19d8._M_color = _S_red;
      local_19d8._M_parent = (_Base_ptr)0x0;
      local_19b8 = 0;
      local_1998 = &local_19a8;
      local_19a8._M_allocated_capacity._0_4_ = _S_red;
      local_19a8._8_8_ = (_Base_ptr)0x0;
      local_1988 = 0;
      local_1980 = -1;
      auStack_1cd0._16_8_ = auStack_1cd0._8_8_;
      _Stack_1c90._M_p = (pointer)aStack_1ca0._8_8_;
      local_1c78._24_8_ = local_1c78._16_8_;
      local_1c30._M_p = (pointer)local_1c40._8_8_;
      local_1c18._M_right = local_1c18._M_left;
      local_1be8._24_8_ = local_1be8._16_8_;
      local_1ba0._M_p = (pointer)local_1bb0._8_8_;
      local_1b88._24_8_ = local_1b88._16_8_;
      local_1b40 = (optional<tinyusdz::Path::PathType>)local_1b50._8_8_;
      local_1b10._M_p = (pointer)local_1b20._8_8_;
      local_1af8._24_8_ = local_1af8._16_8_;
      local_1ab0._M_p = (pointer)local_1ac0._8_8_;
      local_1a98._24_8_ = local_1a98._16_8_;
      local_1a68._24_8_ = local_1a68._16_8_;
      local_1a20 = local_1a28;
      local_19f0 = local_19f8;
      local_19d8._M_right = local_19d8._M_left;
      local_1990 = local_1998;
      memset(local_1978,0,0xf0);
      local_1880 = 0;
      local_1878._M_local_buf[0] = '\0';
      local_1868._M_p = (pointer)&local_1858;
      local_1860 = 0;
      local_1858._M_local_buf[0] = '\0';
      local_1848._M_p = (pointer)&local_1838;
      local_1840 = 0;
      local_1838._M_local_buf[0] = '\0';
      local_1888._M_p = (pointer)&local_1878;
      tinyusdz::tydra::RenderSceneConverterEnv::RenderSceneConverterEnv
                (&local_1828,(Stage *)local_1698);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Triangulate : ",0xe)
      ;
      pcVar17 = "false";
      pcVar16 = "false";
      if (bVar4) {
        pcVar16 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar16,(ulong)bVar4 ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      local_1828.mesh_config.triangulate = bVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Rebuild vertex indices : ",0x19);
      if ((local_21f8 & 1) != 0) {
        pcVar17 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar17,(ulong)((uint)local_21f8 & 1) ^ 5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      local_1828.mesh_config.build_vertex_indices = (bool)((byte)local_21f8 & 1);
      tinyusdz::io::GetBaseDir(&local_2110,(string *)&local_2160);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Add seach path: ",0x10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_2110._M_dataplus._M_p,
                          local_2110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header;
      local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1ef0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1ef0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1ef0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1ef0.addr = (uint8_t *)0x0;
      local_1ef0.size = 0;
      local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1ef0.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar3) {
        bVar4 = tinyusdz::ReadUSDZAssetInfoFromFile
                          (&local_2160,&local_1ef0,&local_2180,&local_21a8,0x4000);
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to read USDZ assetInfo from file: ",0x29);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_21a8._M_dataplus._M_p,
                              local_21a8._M_string_length);
          std::operator<<(poVar8,"\n");
LAB_001284f0:
          exit(-1);
        }
        if (local_2180._M_string_length != 0) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_2180._M_dataplus._M_p,
                              local_2180._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        }
        local_20e8._M_p = local_20e0 + 8;
        local_20f0 = (undefined1  [8])0x0;
        local_20e0._0_8_ = 2;
        local_20e0._8_3_ = 0x2f2e;
        local_20c8 = (pointer)0x0;
        pbStack_20c0 = (pointer)0x0;
        local_20b8 = (pointer)0x0;
        local_20b0 = 0x100000;
        local_20a0._M_left = &local_20a0;
        local_20a0._M_color = _S_red;
        local_20a0._M_parent = (_Base_ptr)0x0;
        local_2080 = 0;
        local_20a0._M_right = local_20a0._M_left;
        bVar4 = tinyusdz::SetupUSDZAssetResolution
                          ((AssetResolutionResolver *)local_20f0,&local_1ef0);
        if (!bVar4) {
          std::operator<<((ostream *)&std::cerr,"Failed to setup AssetResolution for USDZ asset\n");
          goto LAB_001284f0;
        }
        tinyusdz::AssetResolutionResolver::operator=
                  (&local_1828.asset_resolver,(AssetResolutionResolver *)local_20f0);
        tinyusdz::AssetResolutionResolver::~AssetResolutionResolver
                  ((AssetResolutionResolver *)local_20f0);
      }
      else {
        local_20f0 = (undefined1  [8])local_20e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_20f0,local_2110._M_dataplus._M_p,
                   local_2110._M_dataplus._M_p + local_2110._M_string_length);
        __l._M_len = 1;
        __l._M_array = (iterator)local_20f0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2238,__l,(allocator_type *)&local_21c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_1828.asset_resolver._search_paths,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2238);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2238);
        if (local_20f0 != (undefined1  [8])local_20e0) {
          operator_delete((void *)local_20f0,local_20e0._0_8_ + 1);
        }
      }
      if (!NAN(local_21d0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Use timecode : ",0xf);
        poVar8 = std::ostream::_M_insert<double>(local_21d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
      local_1828.timecode = local_21d0;
      bVar4 = tinyusdz::tydra::RenderSceneConverter::ConvertToRenderScene
                        ((RenderSceneConverter *)local_1ce0,&local_1828,&local_1e98);
      if (bVar4) {
        if (local_1840 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ConvertToRenderScene warn: ",0x1b);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_1848._M_p,local_1840);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        }
        local_2238._0_8_ = (pointer)(local_2238 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2238,"kdl","");
        tinyusdz::tydra::DumpRenderScene((string *)local_20f0,&local_1e98,(string *)local_2238);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_20f0,(long)local_20e8._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if (local_20f0 != (undefined1  [8])local_20e0) {
          operator_delete((void *)local_20f0,local_20e0._0_8_ + 1);
        }
        if ((pointer)local_2238._0_8_ != (pointer)(local_2238 + 0x10)) {
          operator_delete((void *)local_2238._0_8_,CONCAT71(local_2238._17_7_,local_2238[0x10]) + 1)
          ;
        }
        if (((local_2138 & 1) != 0) &&
           (std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dump RenderMesh as wavefront .obj\n",0x22),
           local_1e98.meshes.
           super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_1e98.meshes.
           super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
           ._M_impl.super__Vector_impl_data._M_start)) {
          local_21f8 = ___throw_bad_array_new_length;
          __val = 0;
          local_2188 = _VTT;
          do {
            local_2238._0_8_ = local_2238 + 0x10;
            local_2238._8_8_ = (pointer)0x0;
            local_2238[0x10] = '\0';
            local_21c8._M_dataplus._M_p = (pointer)&local_21c8.field_2;
            local_21c8._M_string_length = 0;
            local_21c8.field_2._M_local_buf[0] = '\0';
            bVar4 = tinyusdz::tydra::export_to_obj
                              (&local_1e98,(int)__val,(string *)local_2238,&local_21c8,
                               (string *)&local_2180,(string *)&local_21a8);
            if (!bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"obj export error: ",0x12);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_21a8._M_dataplus._M_p,
                                  local_21a8._M_string_length);
              std::operator<<(poVar8,"\n");
              goto LAB_001284f0;
            }
            cVar15 = '\x01';
            local_2218._M_allocated_capacity = (size_type)&local_2208;
            if (9 < __val) {
              uVar13 = __val;
              cVar2 = '\x04';
              do {
                cVar15 = cVar2;
                if (uVar13 < 100) {
                  cVar15 = cVar15 + -2;
                  goto LAB_00127b1b;
                }
                if (uVar13 < 1000) {
                  cVar15 = cVar15 + -1;
                  goto LAB_00127b1b;
                }
                if (uVar13 < 10000) goto LAB_00127b1b;
                bVar4 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar2 = cVar15 + '\x04';
              } while (bVar4);
              cVar15 = cVar15 + '\x01';
            }
LAB_00127b1b:
            std::__cxx11::string::_M_construct((ulong)&local_2218,cVar15);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_2218._M_allocated_capacity,local_2218._8_4_,__val);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       (local_2218._M_local_buf,
                                        (ulong)local_1e98.meshes.
                                               super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                               ._M_impl.super__Vector_impl_data._M_start[__val].
                                               prim_name._M_dataplus._M_p);
            local_20f0 = (undefined1  [8])local_20e0;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar11) {
              local_20e0._0_8_ = *psVar11;
              local_20e0._8_8_ = plVar9[3];
            }
            else {
              local_20e0._0_8_ = *psVar11;
              local_20f0 = (undefined1  [8])*plVar9;
            }
            local_20e8._M_p = (pointer)plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)local_20f0);
            local_21f0 = &local_21e0;
            plVar12 = plVar9 + 2;
            if ((long *)*plVar9 == plVar12) {
              local_21e0 = *plVar12;
              lStack_21d8 = plVar9[3];
            }
            else {
              local_21e0 = *plVar12;
              local_21f0 = (long *)*plVar9;
            }
            local_21e8 = plVar9[1];
            *plVar9 = (long)plVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_20f0 != (undefined1  [8])local_20e0) {
              operator_delete((void *)local_20f0,local_20e0._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2218._M_allocated_capacity != &local_2208) {
              operator_delete((void *)local_2218._M_allocated_capacity,
                              local_2208._M_allocated_capacity + 1);
            }
            cVar15 = '\x01';
            if (9 < __val) {
              uVar13 = __val;
              cVar2 = '\x04';
              do {
                cVar15 = cVar2;
                if (uVar13 < 100) {
                  cVar15 = cVar15 + -2;
                  goto LAB_00127cb4;
                }
                if (uVar13 < 1000) {
                  cVar15 = cVar15 + -1;
                  goto LAB_00127cb4;
                }
                if (uVar13 < 10000) goto LAB_00127cb4;
                bVar4 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar2 = cVar15 + '\x04';
              } while (bVar4);
              cVar15 = cVar15 + '\x01';
            }
LAB_00127cb4:
            local_2130 = local_2120;
            std::__cxx11::string::_M_construct((ulong)&local_2130,cVar15);
            std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2130,local_2128,__val);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2130,
                                        (ulong)local_1e98.meshes.
                                               super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                               ._M_impl.super__Vector_impl_data._M_start[__val].
                                               prim_name._M_dataplus._M_p);
            local_20f0 = (undefined1  [8])local_20e0;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((size_type *)*plVar9 == psVar11) {
              local_20e0._0_8_ = *psVar11;
              local_20e0._8_8_ = plVar9[3];
            }
            else {
              local_20e0._0_8_ = *psVar11;
              local_20f0 = (undefined1  [8])*plVar9;
            }
            local_20e8._M_p = (pointer)plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)local_20f0);
            pcVar16 = local_2188;
            local_2218._M_allocated_capacity = (size_type)&local_2208;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar14) {
              local_2208._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2208._8_8_ = plVar9[3];
            }
            else {
              local_2208._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2218._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar9;
            }
            local_2218._8_8_ = plVar9[1];
            *plVar9 = (long)paVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_20f0 != (undefined1  [8])local_20e0) {
              operator_delete((void *)local_20f0,local_20e0._0_8_ + 1);
            }
            if (local_2130 != local_2120) {
              operator_delete(local_2130,local_2120[0] + 1);
            }
            std::ofstream::ofstream((string *)local_20f0,(string *)&local_21f0,_S_out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_20f0,(char *)local_2238._0_8_,local_2238._8_8_);
            local_20f0 = (undefined1  [8])pcVar16;
            *(ulong *)(local_20f0 + *(long *)(pcVar16 + -0x18)) = local_21f8;
            std::filebuf::~filebuf((filebuf *)&local_20e8);
            std::ios_base::~ios_base(local_1ff8);
            std::ofstream::ofstream((string *)local_20f0,(string *)local_2218._M_local_buf,_S_out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_20f0,local_21c8._M_dataplus._M_p,local_21c8._M_string_length
                      );
            local_20f0 = (undefined1  [8])pcVar16;
            *(ulong *)(local_20f0 + *(long *)(pcVar16 + -0x18)) = local_21f8;
            std::filebuf::~filebuf((filebuf *)&local_20e8);
            std::ios_base::~ios_base(local_1ff8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Wrote ",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_21f0,local_21e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2218._M_allocated_capacity != &local_2208) {
              operator_delete((void *)local_2218._M_allocated_capacity,
                              local_2208._M_allocated_capacity + 1);
            }
            if (local_21f0 != &local_21e0) {
              operator_delete(local_21f0,local_21e0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_21c8._M_dataplus._M_p != &local_21c8.field_2) {
              operator_delete(local_21c8._M_dataplus._M_p,
                              CONCAT71(local_21c8.field_2._M_allocated_capacity._1_7_,
                                       local_21c8.field_2._M_local_buf[0]) + 1);
            }
            if ((pointer)local_2238._0_8_ != (pointer)(local_2238 + 0x10)) {
              operator_delete((void *)local_2238._0_8_,
                              CONCAT71(local_2238._17_7_,local_2238[0x10]) + 1);
            }
            __val = __val + 1;
          } while (__val < (ulong)(((long)local_1e98.meshes.
                                          super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1e98.meshes.
                                          super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5) *
                                  -0x7063e7063e7063e7));
        }
        iVar18 = 0;
        if ((local_2140 & 1) != 0) {
          tinyusdz::io::GetFileExtension((string *)local_2238,(string *)&local_2160);
          tinyusdz::io::GetBaseFilename(&local_21c8,(string *)&local_2160);
          if ((local_21c8._M_string_length < (ulong)local_2238._8_8_) ||
             (lVar10 = std::__cxx11::string::find
                                 ((char *)&local_21c8,local_2238._0_8_,
                                  local_21c8._M_string_length - local_2238._8_8_), lVar10 == -1)) {
            local_20f0 = (undefined1  [8])local_20e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_20f0,local_21c8._M_dataplus._M_p,
                       local_21c8._M_dataplus._M_p +
                       (long)(_Alloc_hider *)local_21c8._M_string_length);
          }
          else {
            std::__cxx11::string::substr((ulong)local_20f0,(ulong)&local_21c8);
          }
          plVar9 = (long *)std::__cxx11::string::append(local_20f0);
          plVar12 = plVar9 + 2;
          if ((long *)*plVar9 == plVar12) {
            local_21e0 = *plVar12;
            lStack_21d8 = plVar9[3];
            local_21f0 = &local_21e0;
          }
          else {
            local_21e0 = *plVar12;
            local_21f0 = (long *)*plVar9;
          }
          local_21e8 = plVar9[1];
          *plVar9 = (long)plVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_20f0 != (undefined1  [8])local_20e0) {
            operator_delete((void *)local_20f0,local_20e0._0_8_ + 1);
          }
          local_2218._8_8_ = 0;
          local_2208._M_allocated_capacity = local_2208._M_allocated_capacity & 0xffffffffffffff00;
          local_2218._M_allocated_capacity = (size_type)&local_2208;
          bVar4 = tinyusdz::tydra::export_to_usda
                            (&local_1e98,(string *)&local_2218,(string *)&local_2180,
                             (string *)&local_21a8);
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Failed to export RenderScene to USDA: ",0x26);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_21a8._M_dataplus._M_p,
                                local_21a8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          if (local_2180._M_string_length != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WARN: ",6);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_2180._M_dataplus._M_p,
                                local_2180._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          std::ofstream::ofstream(local_20f0,(string *)&local_21f0,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_20f0,(char *)local_2218._M_allocated_capacity,local_2218._8_8_
                    );
          local_20f0 = (undefined1  [8])_VTT;
          *(ulong *)(local_20f0 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
          std::filebuf::~filebuf((filebuf *)&local_20e8);
          std::ios_base::~ios_base(local_1ff8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Exported RenderScene as USDA: ",0x1e);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_21f0,local_21e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2218._M_allocated_capacity != &local_2208) {
            operator_delete((void *)local_2218._M_allocated_capacity,
                            local_2208._M_allocated_capacity + 1);
          }
          if (local_21f0 != &local_21e0) {
            operator_delete(local_21f0,local_21e0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_21c8._M_dataplus._M_p != &local_21c8.field_2) {
            operator_delete(local_21c8._M_dataplus._M_p,
                            CONCAT71(local_21c8.field_2._M_allocated_capacity._1_7_,
                                     local_21c8.field_2._M_local_buf[0]) + 1);
          }
          iVar18 = 0;
          if ((pointer)local_2238._0_8_ != (pointer)(local_2238 + 0x10)) {
            operator_delete((void *)local_2238._0_8_,
                            CONCAT71(local_2238._17_7_,local_2238[0x10]) + 1);
            iVar18 = 0;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to convert USD Stage to RenderScene: \n",0x2d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1868._M_p,local_1860);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        iVar18 = 1;
      }
      if (local_1ef0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1ef0.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1ef0.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1ef0.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)&local_1ef0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2110._M_dataplus._M_p != &local_2110.field_2) {
        operator_delete(local_2110._M_dataplus._M_p,local_2110.field_2._M_allocated_capacity + 1);
      }
      tinyusdz::tydra::RenderSceneConverterEnv::~RenderSceneConverterEnv(&local_1828);
      tinyusdz::tydra::RenderSceneConverter::~RenderSceneConverter
                ((RenderSceneConverter *)local_1ce0);
      tinyusdz::tydra::RenderScene::~RenderScene(&local_1e98);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to load USD file: ",0x19);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_2160._M_dataplus._M_p,
                          local_2160._M_string_length);
      iVar18 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    tinyusdz::Stage::~Stage((Stage *)local_1698);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_21a8._M_dataplus._M_p != &local_21a8.field_2) {
      operator_delete(local_21a8._M_dataplus._M_p,
                      CONCAT71(local_21a8.field_2._M_allocated_capacity._1_7_,
                               local_21a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2180._M_dataplus._M_p != &local_2180.field_2) {
      operator_delete(local_2180._M_dataplus._M_p,
                      CONCAT71(local_2180.field_2._M_allocated_capacity._1_7_,
                               local_2180.field_2._M_local_buf[0]) + 1);
    }
LAB_001283e3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2160._M_dataplus._M_p != &local_2160.field_2) {
      operator_delete(local_2160._M_dataplus._M_p,
                      CONCAT71(local_2160.field_2._M_allocated_capacity._1_7_,
                               local_2160.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar18;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "Usage: " << argv[0] << " input.usd [OPTIONS].\n";
    std::cout << "\n\nOptions\n\n";
    std::cout << "  --timecode VALUE: Specify timecode value(e.g. 3.14)\n";
    std::cout << "  --noidxbuild: Do not rebuild vertex indices\n";
    std::cout << "  --notri: Do not triangulate mesh\n";
    std::cout << "  --nousdprint: Do not print parsed USD\n";
    std::cout
        << "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n";
    std::cout << "  --dumpusd: Dump scene as USD(USDA Ascii)\n";
    return EXIT_FAILURE;
  }

  // When Xform, Mesh, Material, etc. have time-varying values,
  // values are evaluated at `timecode` time(except for animation values in
  // SkelAnimation)
  double timecode = tinyusdz::value::TimeCode::Default();

  bool build_indices = true;
  bool triangulate = true;
  bool export_obj = false;
  bool export_usd = false;
  bool no_usdprint = false;

  std::string filepath;
  for (int i = 1; i < argc; i++) {
    if (strcmp(argv[i], "--notri") == 0) {
      triangulate = false;
    } else if (strcmp(argv[i], "--noidxbuild") == 0) {
      build_indices = false;
    } else if (strcmp(argv[i], "--nousdprint") == 0) {
      no_usdprint = true;
    } else if (strcmp(argv[i], "--dumpobj") == 0) {
      export_obj = true;
    } else if (strcmp(argv[i], "--dumpusd") == 0) {
      export_usd = true;
    } else if (strcmp(argv[i], "--timecode") == 0) {
      if ((i + 1) >= argc) {
        std::cerr << "arg is missing for --timecode flag.\n";
        return -1;
      }
      timecode = std::stod(argv[i + 1]);
      std::cout << "Use timecode: " << timecode << "\n";
      i++;
    } else {
      filepath = argv[i];
    }
  }

  std::string warn;
  std::string err;

  tinyusdz::Stage stage;

  if (!tinyusdz::IsUSD(filepath)) {
    std::cerr << "File not found or not a USD format: " << filepath << "\n";
  }

  bool ret = tinyusdz::LoadUSDFromFile(filepath, &stage, &warn, &err);
  if (!warn.empty()) {
    std::cerr << "WARN : " << warn << "\n";
  }

  if (!err.empty()) {
    std::cerr << "ERR : " << err << "\n";
  }

  if (!ret) {
    std::cerr << "Failed to load USD file: " << filepath << "\n";
    return EXIT_FAILURE;
  }

  bool is_usdz = tinyusdz::IsUSDZ(filepath);

  if (!no_usdprint) {
    std::string s = stage.ExportToString();
    std::cout << s << "\n";
    std::cout << "--------------------------------------"
              << "\n";
  }

  // RenderScene: Scene graph object which is suited for GL/Vulkan renderer
  tinyusdz::tydra::RenderScene render_scene;
  tinyusdz::tydra::RenderSceneConverter converter;
  tinyusdz::tydra::RenderSceneConverterEnv env(stage);

  std::cout << "Triangulate : " << (triangulate ? "true" : "false") << "\n";
  env.mesh_config.triangulate = triangulate;
  std::cout << "Rebuild vertex indices : " << (build_indices ? "true" : "false")
            << "\n";
  env.mesh_config.build_vertex_indices = build_indices;

  // Add base directory of .usd file to search path.
  std::string usd_basedir = tinyusdz::io::GetBaseDir(filepath);
  std::cout << "Add seach path: " << usd_basedir << "\n";

  tinyusdz::USDZAsset usdz_asset;
  if (is_usdz) {
    // Setup AssetResolutionResolver to read a asset(file) from memory.
    if (!tinyusdz::ReadUSDZAssetInfoFromFile(filepath, &usdz_asset, &warn,
                                             &err)) {
      std::cerr << "Failed to read USDZ assetInfo from file: " << err << "\n";
      exit(-1);
    }
    if (warn.size()) {
      std::cout << warn << "\n";
    }

    tinyusdz::AssetResolutionResolver arr;

    // NOTE: Pointer address of usdz_asset must be valid until the call of
    // RenderSceneConverter::ConvertToRenderScene.
    if (!tinyusdz::SetupUSDZAssetResolution(arr, &usdz_asset)) {
      std::cerr << "Failed to setup AssetResolution for USDZ asset\n";
      exit(-1);
    };

    env.asset_resolver = arr;

  } else {
    env.set_search_paths({usd_basedir});

    // TODO: Add example to set user-defined AssetResolutionResolver
    // AssetResolutionResolver arr;
    // ...
    // env.asset_resolver(arr);
  }

  if (!tinyusdz::value::TimeCode(timecode).is_default()) {
    std::cout << "Use timecode : " << timecode << "\n";
  }
  env.timecode = timecode;
  ret = converter.ConvertToRenderScene(env, &render_scene);
  if (!ret) {
    std::cerr << "Failed to convert USD Stage to RenderScene: \n"
              << converter.GetError() << "\n";
    return EXIT_FAILURE;
  }

  if (converter.GetWarning().size()) {
    std::cout << "ConvertToRenderScene warn: " << converter.GetWarning()
              << "\n";
  }

  std::cout << DumpRenderScene(render_scene) << "\n";

  if (export_obj) {
    std::cout << "Dump RenderMesh as wavefront .obj\n";
    for (size_t i = 0; i < render_scene.meshes.size(); i++) {
      std::string obj_str;
      std::string mtl_str;
      if (!tinyusdz::tydra::export_to_obj(render_scene, i, obj_str, mtl_str,
                                          &warn, &err)) {
        std::cerr << "obj export error: " << err << "\n";
        exit(-1);
      }

      std::string obj_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".obj";
      std::string mtl_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".mtl";
      {
        std::ofstream obj_ofs(obj_filename);
        obj_ofs << obj_str;
      }

      {
        std::ofstream mtl_ofs(mtl_filename);
        mtl_ofs << mtl_str;
      }
      std::cout << "  Wrote " << obj_filename << "\n";
    }
  }

  if (export_usd) {
    std::string ext = tinyusdz::io::GetFileExtension(filepath);
    std::string usd_basename = tinyusdz::io::GetBaseFilename(filepath);
    std::string usd_filename =
        tinyusdz::removeSuffix(usd_basename, ext) + "export.usda";

    std::string usda_str;
    if (!tinyusdz::tydra::export_to_usda(render_scene, usda_str, &warn, &err)) {
      std::cerr << "Failed to export RenderScene to USDA: " << err << "\n";
    }
    if (warn.size()) {
      std::cout << "WARN: " << warn << "\n";
    }

    {
      std::ofstream ofs(usd_filename);
      ofs << usda_str;
    }
    std::cout << "Exported RenderScene as USDA: " << usd_filename << "\n";
  }

  return EXIT_SUCCESS;
}